

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseTableTag(TidyDocImpl *doc,Node *table,GetTokenMode mode)

{
  uint uVar1;
  Lexer *pLVar2;
  Bool BVar3;
  uint uVar4;
  Node *node;
  uint code;
  Node *pNVar5;
  Node **ppNVar6;
  
  pLVar2 = doc->lexer;
  prvTidyDeferDup(doc);
  uVar1 = pLVar2->istackbase;
  pLVar2->istackbase = pLVar2->istacksize;
LAB_0013cd7e:
  do {
    node = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node == (Node *)0x0) {
      node = (Node *)0x0;
      code = 600;
LAB_0013cf79:
      prvTidyReport(doc,table,node,code);
LAB_0013cf80:
      pLVar2->istackbase = uVar1;
      return;
    }
    if (node->tag == table->tag) {
      if (node->type == EndTag) {
        prvTidyFreeNode(doc,node);
      }
      else {
        prvTidyUngetToken(doc);
        prvTidyReport(doc,table,node,0x27c);
      }
      pLVar2->istackbase = uVar1;
      table->closed = yes;
      return;
    }
    BVar3 = InsertMisc(table,node);
  } while (BVar3 != no);
  if (node->tag == (Dict *)0x0) {
    if (node->type == TextNode) {
LAB_0013ce37:
      BVar3 = prvTidynodeIsText(node);
      if ((BVar3 == no) && (BVar3 = prvTidynodeHasCM(node,0x18), BVar3 == no)) {
        if ((node->tag->model & 4) == 0) goto LAB_0013ce02;
        MoveToHead(doc,table,node);
      }
      else {
        prvTidyInsertNodeBeforeElement(table,node);
        prvTidyReport(doc,table,node,0x27c);
        pLVar2->exiled = yes;
        if (node->type != TextNode) {
          ParseTag(doc,node,IgnoreWhitespace);
        }
        pLVar2->exiled = no;
      }
      goto LAB_0013cd7e;
    }
  }
  else {
    if (node->type != EndTag) {
      uVar4 = node->tag->id - TidyTag_TABLE;
      if ((5 < uVar4) || ((0x25U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_0013ce37;
      prvTidyUngetToken(doc);
      node = prvTidyInferredTag(doc,TidyTag_TR);
      prvTidyReport(doc,table,node,0x25f);
    }
LAB_0013ce02:
    if (node->type == EndTag) {
      if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_FORM)) {
        BVar3 = prvTidynodeHasCM(node,0x280);
        if ((BVar3 == no) && (BVar3 = prvTidynodeHasCM(node,0x18), pNVar5 = table, BVar3 == no)) {
          while (pNVar5 = pNVar5->parent, pNVar5 != (Node *)0x0) {
            if (node->tag == pNVar5->tag) {
              prvTidyReport(doc,table,node,599);
              prvTidyUngetToken(doc);
              goto LAB_0013cf80;
            }
          }
          goto LAB_0013ced9;
        }
      }
      else {
        *(byte *)&doc->badForm = (byte)doc->badForm | 1;
      }
    }
    else {
LAB_0013ced9:
      if ((node->tag->model & 0x80) == 0) {
        prvTidyUngetToken(doc);
        code = 0x27c;
        goto LAB_0013cf79;
      }
      BVar3 = prvTidynodeIsElement(node);
      if (BVar3 != no) {
        node->parent = table;
        pNVar5 = table->last;
        node->prev = pNVar5;
        ppNVar6 = &pNVar5->next;
        if (pNVar5 == (Node *)0x0) {
          ppNVar6 = &table->content;
        }
        *ppNVar6 = node;
        table->last = node;
        ParseTag(doc,node,IgnoreWhitespace);
        goto LAB_0013cd7e;
      }
    }
  }
  prvTidyReport(doc,table,node,0x233);
  prvTidyFreeNode(doc,node);
  goto LAB_0013cd7e;
}

Assistant:

void TY_(ParseTableTag)(TidyDocImpl* doc, Node *table, GetTokenMode ARG_UNUSED(mode))
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_table = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node, *parent;
    uint istackbase;

    TY_(DeferDup)( doc );
    istackbase = lexer->istackbase;
    lexer->istackbase = lexer->istacksize;
#if defined(ENABLE_DEBUG_LOG)
    in_parse_table++;
    SPRTF("Entering ParseTableTag %d...\n",in_parse_table);
#endif
    
    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == table->tag )
        {
            if (node->type == EndTag)
            {
                TY_(FreeNode)(doc, node);
            }
            else
            {
                /* Issue #498 - If a <table> in a <table>
                 * just close the current table, and issue a 
                 * warning. The previous action was to discard
                 * this second <table>
                 */
                TY_(UngetToken)(doc);
                TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
            }
            lexer->istackbase = istackbase;
            table->closed = yes;
#if defined(ENABLE_DEBUG_LOG)
            in_parse_table--;
            SPRTF("Exit ParseTableTag 1 %d... EndTag\n",in_parse_table);
#endif
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(table, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL && node->type != TextNode)
        {
            TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* if TD or TH or text or inline or block then infer <TR> */

        if (node->type != EndTag)
        {
            if ( nodeIsTD(node) || nodeIsTH(node) || nodeIsTABLE(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_TR);
                TY_(Report)(doc, table, node, MISSING_STARTTAG);
            }
            else if ( TY_(nodeIsText)(node) ||TY_(nodeHasCM)(node,CM_BLOCK|CM_INLINE) )
            {
                TY_(InsertNodeBeforeElement)(table, node);
                TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
                lexer->exiled = yes;

                if (node->type != TextNode) 
                    ParseTag(doc, node, IgnoreWhitespace);

                lexer->exiled = no;
                continue;
            }
            else if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, table, node);
                continue;
            }
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* best to discard unexpected block/inline end tags */
            if ( TY_(nodeHasCM)(node, CM_TABLE|CM_ROW) ||
                 TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
            {
                TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = table->parent;
                  parent != NULL;
                  parent = parent->parent )
            {
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, table, node, MISSING_ENDTAG_BEFORE );
                    TY_(UngetToken)( doc );
                    lexer->istackbase = istackbase;
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_table--;
                    SPRTF("Exit ParseTableTag 2 %d... missing EndTag\n",in_parse_table);
#endif
                    return;
                }
            }
        }

        if (!(node->tag->model & CM_TABLE))
        {
            TY_(UngetToken)( doc );
            TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
            lexer->istackbase = istackbase;
#if defined(ENABLE_DEBUG_LOG)
            in_parse_table--;
            SPRTF("Exit ParseTableTag 3 %d... CM_TABLE\n",in_parse_table);
#endif
            return;
        }

        if (TY_(nodeIsElement)(node))
        {
            TY_(InsertNodeAtEnd)(table, node);
            ParseTag(doc, node, IgnoreWhitespace);
            continue;
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, table, node, MISSING_ENDTAG_FOR);
    lexer->istackbase = istackbase;
#if defined(ENABLE_DEBUG_LOG)
    in_parse_table--;
    SPRTF("Exit ParseTableTag 4 %d... missing end\n",in_parse_table);
#endif
}